

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ossl_shutdown(Curl_easy *data,connectdata *conn,int sockindex)

{
  ssl_backend_data *psVar1;
  bool bVar2;
  int iVar3;
  ulong error;
  uint *puVar4;
  char *local_178;
  int local_154;
  int what;
  int loop;
  ssl_backend_data *backend;
  _Bool done;
  int err;
  int buffsize;
  ssize_t nread;
  unsigned_long sslerror;
  char buf [256];
  ssl_connect_data *connssl;
  int retval;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  connssl._0_4_ = 0;
  buf._248_8_ = conn->ssl + sockindex;
  bVar2 = false;
  psVar1 = ((ssl_connect_data *)buf._248_8_)->backend;
  local_154 = 10;
  if ((data->set).ftp_ccc == '\x02') {
    SSL_shutdown((SSL *)psVar1->handle);
  }
  if (psVar1->handle != (SSL *)0x0) {
    while( true ) {
      iVar3 = local_154;
      if (!bVar2) {
        local_154 = local_154 + -1;
      }
      if (bVar2 || iVar3 == 0) break;
      iVar3 = Curl_socket_check(conn->sock[sockindex],-1,-1,10000);
      if (iVar3 < 1) {
        if (iVar3 == 0) {
          Curl_failf(data,"SSL shutdown timeout");
        }
        else {
          puVar4 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar4);
          connssl._0_4_ = -1;
        }
        bVar2 = true;
      }
      else {
        ERR_clear_error();
        iVar3 = SSL_read((SSL *)psVar1->handle,&sslerror,0x100);
        iVar3 = SSL_get_error((SSL *)psVar1->handle,iVar3);
        switch(iVar3) {
        case 0:
        case 6:
          bVar2 = true;
          break;
        default:
          error = ERR_get_error();
          if (error == 0) {
            local_178 = SSL_ERROR_to_str(iVar3);
          }
          else {
            local_178 = ossl_strerror(error,(char *)&sslerror,0x100);
          }
          puVar4 = (uint *)__errno_location();
          Curl_failf(data,"OpenSSL SSL_read on shutdown: %s, errno %d",local_178,(ulong)*puVar4);
          bVar2 = true;
          break;
        case 2:
          Curl_infof(data,"SSL_ERROR_WANT_READ");
          break;
        case 3:
          Curl_infof(data,"SSL_ERROR_WANT_WRITE");
          bVar2 = true;
        }
      }
    }
    if ((*(ulong *)&(data->set).field_0x8e2 >> 0x1b & 1) != 0) {
      iVar3 = SSL_get_shutdown((SSL *)psVar1->handle);
      if (iVar3 == 1) {
        Curl_infof(data,"SSL_get_shutdown() returned SSL_SENT_SHUTDOWN");
      }
      else if (iVar3 == 2) {
        Curl_infof(data,"SSL_get_shutdown() returned SSL_RECEIVED_SHUTDOWN");
      }
      else if (iVar3 == 3) {
        Curl_infof(data,"SSL_get_shutdown() returned SSL_SENT_SHUTDOWN|SSL_RECEIVED__SHUTDOWN");
      }
    }
    SSL_free((SSL *)psVar1->handle);
    psVar1->handle = (SSL *)0x0;
  }
  return (int)connssl;
}

Assistant:

static int ossl_shutdown(struct Curl_easy *data,
                         struct connectdata *conn, int sockindex)
{
  int retval = 0;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  char buf[256]; /* We will use this for the OpenSSL error buffer, so it has
                    to be at least 256 bytes long. */
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;
  int err;
  bool done = FALSE;
  struct ssl_backend_data *backend = connssl->backend;
  int loop = 10;

  DEBUGASSERT(backend);

#ifndef CURL_DISABLE_FTP
  /* This has only been tested on the proftpd server, and the mod_tls code
     sends a close notify alert without waiting for a close notify alert in
     response. Thus we wait for a close notify alert from the server, but
     we do not send one. Let's hope other servers do the same... */

  if(data->set.ftp_ccc == CURLFTPSSL_CCC_ACTIVE)
      (void)SSL_shutdown(backend->handle);
#endif

  if(backend->handle) {
    buffsize = (int)sizeof(buf);
    while(!done && loop--) {
      int what = SOCKET_READABLE(conn->sock[sockindex],
                                 SSL_SHUTDOWN_TIMEOUT);
      if(what > 0) {
        ERR_clear_error();

        /* Something to read, let's do it and hope that it is the close
           notify alert from the server */
        nread = (ssize_t)SSL_read(backend->handle, buf, buffsize);
        err = SSL_get_error(backend->handle, (int)nread);

        switch(err) {
        case SSL_ERROR_NONE: /* this is not an error */
        case SSL_ERROR_ZERO_RETURN: /* no more data */
          /* This is the expected response. There was no data but only
             the close notify alert */
          done = TRUE;
          break;
        case SSL_ERROR_WANT_READ:
          /* there's data pending, re-invoke SSL_read() */
          infof(data, "SSL_ERROR_WANT_READ");
          break;
        case SSL_ERROR_WANT_WRITE:
          /* SSL wants a write. Really odd. Let's bail out. */
          infof(data, "SSL_ERROR_WANT_WRITE");
          done = TRUE;
          break;
        default:
          /* openssl/ssl.h says "look at error stack/return value/errno" */
          sslerror = ERR_get_error();
          failf(data, OSSL_PACKAGE " SSL_read on shutdown: %s, errno %d",
                (sslerror ?
                 ossl_strerror(sslerror, buf, sizeof(buf)) :
                 SSL_ERROR_to_str(err)),
                SOCKERRNO);
          done = TRUE;
          break;
        }
      }
      else if(0 == what) {
        /* timeout */
        failf(data, "SSL shutdown timeout");
        done = TRUE;
      }
      else {
        /* anything that gets here is fatally bad */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        retval = -1;
        done = TRUE;
      }
    } /* while()-loop for the select() */

    if(data->set.verbose) {
#ifdef HAVE_SSL_GET_SHUTDOWN
      switch(SSL_get_shutdown(backend->handle)) {
      case SSL_SENT_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN");
        break;
      case SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_RECEIVED_SHUTDOWN");
        break;
      case SSL_SENT_SHUTDOWN|SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN|"
              "SSL_RECEIVED__SHUTDOWN");
        break;
      }
#endif
    }

    SSL_free(backend->handle);
    backend->handle = NULL;
  }
  return retval;
}